

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::decode_next_row(jpeg_decoder *this)

{
  huff_tables *pH;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  short *psVar11;
  int r;
  int extra_bits;
  int local_50;
  int local_4c;
  ulong local_48;
  short *local_40;
  long local_38;
  
  if (0 < this->m_mcus_per_row) {
    local_48 = 0;
    do {
      if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
        process_restart(this);
      }
      if (0 < this->m_blocks_per_mcu) {
        psVar11 = this->m_pMCU_coefficients;
        lVar10 = 0;
        do {
          iVar4 = this->m_mcu_org[lVar10];
          local_40 = this->m_quant[this->m_comp_quant[iVar4]];
          uVar2 = huff_decode(this,this->m_pHuff_tabs[this->m_comp_dc_tab[iVar4]],&local_50);
          iVar5 = local_50;
          if (local_50 < *(int *)(s_extend_test + (ulong)(uVar2 & 0xf) * 4)) {
            iVar5 = local_50 + *(int *)(s_extend_offset + (ulong)(uVar2 & 0xf) * 4);
          }
          uVar6 = iVar5 + this->m_last_dc_val[iVar4];
          this->m_last_dc_val[iVar4] = uVar6;
          *psVar11 = (short)uVar6 * *local_40;
          iVar5 = this->m_mcu_block_max_zag[lVar10];
          pH = this->m_pHuff_tabs[this->m_comp_ac_tab[iVar4]];
          iVar4 = 1;
          local_38 = lVar10;
          do {
            uVar2 = huff_decode(this,pH,&local_4c);
            local_50 = (int)uVar2 >> 4;
            uVar7 = uVar2 & 0xf;
            iVar3 = iVar4;
            if (uVar7 == 0) {
              if (local_50 == 0xf) {
                if (0x30 < iVar4) goto LAB_001098ac;
                if (iVar4 < iVar5) {
                  iVar3 = iVar5 - iVar4;
                  if (0xf < iVar3) {
                    iVar3 = 0x10;
                  }
                  lVar10 = 0;
                  do {
                    if (0x40 - (long)iVar4 == lVar10) {
                      __assert_fail("kt <= 63",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                                    ,0x729,"void jpgd::jpeg_decoder::decode_next_row()");
                    }
                    psVar11[(int)(&g_ZAG)[lVar10 + iVar4]] = 0;
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                if (psVar11[*(int *)(&UNK_0011939c + (long)iVar4 * 4)] != 0) {
                  __assert_fail("p[g_ZAG[k]] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                                ,0x72f,"void jpgd::jpeg_decoder::decode_next_row()");
                }
                iVar3 = iVar4 + 0xf;
                goto LAB_001097b2;
              }
              bVar1 = false;
            }
            else {
              if (0xf < uVar2) {
                iVar3 = local_50 + iVar4;
                if (0x3f < iVar3) {
LAB_001098ac:
                  stop_decoding(this,JPGD_DECODE_ERROR);
                }
                if (iVar4 < iVar5) {
                  iVar9 = iVar5 - iVar4;
                  iVar8 = iVar9;
                  if (local_50 < iVar9) {
                    iVar8 = local_50;
                  }
                  if (iVar8 != 0) {
                    if (local_50 < iVar9) {
                      iVar9 = local_50;
                    }
                    lVar10 = 0;
                    do {
                      psVar11[(int)(&g_ZAG)[lVar10 + iVar4]] = 0;
                      lVar10 = lVar10 + 1;
                    } while (iVar9 != (int)lVar10);
                  }
                }
              }
              iVar4 = local_4c;
              if (local_4c < *(int *)(s_extend_test + (ulong)uVar7 * 4)) {
                iVar4 = local_4c + *(int *)(s_extend_offset + (ulong)uVar7 * 4);
              }
              if (0x3f < iVar3) {
                __assert_fail("k < 64",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                              ,0x718,"void jpgd::jpeg_decoder::decode_next_row()");
              }
              psVar11[(int)(&g_ZAG)[iVar3]] = (short)iVar4 * local_40[iVar3];
LAB_001097b2:
              bVar1 = true;
            }
            iVar4 = iVar3;
          } while ((bVar1) && (iVar4 = iVar3 + 1, iVar3 < 0x3f));
          if (iVar4 < iVar5) {
            lVar10 = 0;
            do {
              psVar11[(int)(&g_ZAG)[lVar10 + iVar4]] = 0;
              lVar10 = lVar10 + 1;
            } while ((long)iVar5 - (long)iVar4 != lVar10);
          }
          this->m_mcu_block_max_zag[local_38] = iVar4;
          lVar10 = local_38 + 1;
          psVar11 = psVar11 + 0x40;
        } while (lVar10 < this->m_blocks_per_mcu);
      }
      iVar4 = (int)local_48;
      if (this->m_freq_domain_chroma_upsample == false) {
        transform_mcu(this,iVar4);
      }
      else {
        transform_mcu_expand(this,iVar4);
      }
      this->m_restarts_left = this->m_restarts_left + -1;
      local_48 = (ulong)(iVar4 + 1U);
    } while ((int)(iVar4 + 1U) < this->m_mcus_per_row);
  }
  return;
}

Assistant:

void jpeg_decoder::decode_next_row()
{
  int row_block = 0;

  for (int mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++)
  {
    if ((m_restart_interval) && (m_restarts_left == 0))
      process_restart();

    jpgd_block_t* p = m_pMCU_coefficients;
    for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++, p += 64)
    {
      int component_id = m_mcu_org[mcu_block];
      jpgd_quant_t* q = m_quant[m_comp_quant[component_id]];

      int r, s;
      s = huff_decode(m_pHuff_tabs[m_comp_dc_tab[component_id]], r);
      s = JPGD_HUFF_EXTEND(r, s);

      m_last_dc_val[component_id] = (s += m_last_dc_val[component_id]);

      p[0] = static_cast<jpgd_block_t>(s * q[0]);

      int prev_num_set = m_mcu_block_max_zag[mcu_block];

      huff_tables *pH = m_pHuff_tabs[m_comp_ac_tab[component_id]];

      int k;
      for (k = 1; k < 64; k++)
      {
        int extra_bits;
        s = huff_decode(pH, extra_bits);

        r = s >> 4;
        s &= 15;

        if (s)
        {
          if (r)
          {
            if ((k + r) > 63)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set)
            {
              int n = JPGD_MIN(r, prev_num_set - k);
              int kt = k;
              while (n--)
                p[g_ZAG[kt++]] = 0;
            }

            k += r;
          }
          
          s = JPGD_HUFF_EXTEND(extra_bits, s);

          JPGD_ASSERT(k < 64);

          p[g_ZAG[k]] = static_cast<jpgd_block_t>(dequantize_ac(s, q[k])); //s * q[k];
        }
        else
        {
          if (r == 15)
          {
            if ((k + 16) > 64)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set)
            {
              int n = JPGD_MIN(16, prev_num_set - k);
              int kt = k;
              while (n--)
              {
                JPGD_ASSERT(kt <= 63);
                p[g_ZAG[kt++]] = 0;
              }
            }

            k += 16 - 1; // - 1 because the loop counter is k
            JPGD_ASSERT(p[g_ZAG[k]] == 0);
          }
          else
            break;
        }
      }

      if (k < prev_num_set)
      {
        int kt = k;
        while (kt < prev_num_set)
          p[g_ZAG[kt++]] = 0;
      }

      m_mcu_block_max_zag[mcu_block] = k;

      row_block++;
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);

    m_restarts_left--;
  }
}